

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_operand.cpp
# Opt level: O0

void spvtools::EmitNumericLiteral
               (ostream *out,spv_parsed_instruction_t *inst,spv_parsed_operand_t *operand)

{
  spv_number_kind_t sVar1;
  FloatProxy<double> local_40;
  uint_type local_38;
  uint64_t bits;
  FloatProxy<spvtools::utils::Float16> local_26;
  uint_type local_24;
  spv_parsed_operand_t *psStack_20;
  uint32_t word;
  spv_parsed_operand_t *operand_local;
  spv_parsed_instruction_t *inst_local;
  ostream *out_local;
  
  if (((((operand->type == SPV_OPERAND_TYPE_LITERAL_INTEGER) ||
        (operand->type == SPV_OPERAND_TYPE_LITERAL_FLOAT)) ||
       (operand->type == SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER)) ||
      ((operand->type == SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER ||
       (operand->type == SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER)))) &&
     ((operand->num_words != 0 && (operand->num_words < 3)))) {
    local_24 = inst->words[operand->offset];
    psStack_20 = operand;
    operand_local = (spv_parsed_operand_t *)inst;
    inst_local = (spv_parsed_instruction_t *)out;
    if (operand->num_words == 1) {
      sVar1 = operand->number_kind;
      if (sVar1 == SPV_NUMBER_UNSIGNED_INT) {
        std::ostream::operator<<(out,local_24);
      }
      else if (sVar1 == SPV_NUMBER_SIGNED_INT) {
        std::ostream::operator<<(out,local_24);
      }
      else if (sVar1 == SPV_NUMBER_FLOATING) {
        if (operand->number_bit_width == 0x10) {
          utils::FloatProxy<spvtools::utils::Float16>::FloatProxy(&local_26,(uint_type)local_24);
          utils::operator<<(out,&local_26);
        }
        else {
          utils::FloatProxy<float>::FloatProxy((FloatProxy<float> *)((long)&bits + 4),local_24);
          utils::operator<<(out,(FloatProxy<float> *)((long)&bits + 4));
        }
      }
    }
    else if (operand->num_words == 2) {
      local_38 = CONCAT44(inst->words[(ulong)operand->offset + 1],local_24);
      sVar1 = operand->number_kind;
      if (sVar1 == SPV_NUMBER_UNSIGNED_INT) {
        std::ostream::operator<<(out,local_38);
      }
      else if (sVar1 == SPV_NUMBER_SIGNED_INT) {
        std::ostream::operator<<(out,local_38);
      }
      else if (sVar1 == SPV_NUMBER_FLOATING) {
        utils::FloatProxy<double>::FloatProxy(&local_40,local_38);
        utils::operator<<(out,&local_40);
      }
    }
  }
  return;
}

Assistant:

void EmitNumericLiteral(std::ostream* out, const spv_parsed_instruction_t& inst,
                        const spv_parsed_operand_t& operand) {
  if (operand.type != SPV_OPERAND_TYPE_LITERAL_INTEGER &&
      operand.type != SPV_OPERAND_TYPE_LITERAL_FLOAT &&
      operand.type != SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER &&
      operand.type != SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER &&
      operand.type != SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER)
    return;
  if (operand.num_words < 1) return;
  // TODO(dneto): Support more than 64-bits at a time.
  if (operand.num_words > 2) return;

  const uint32_t word = inst.words[operand.offset];
  if (operand.num_words == 1) {
    switch (operand.number_kind) {
      case SPV_NUMBER_SIGNED_INT:
        *out << int32_t(word);
        break;
      case SPV_NUMBER_UNSIGNED_INT:
        *out << word;
        break;
      case SPV_NUMBER_FLOATING:
        if (operand.number_bit_width == 16) {
          *out << spvtools::utils::FloatProxy<spvtools::utils::Float16>(
              uint16_t(word & 0xFFFF));
        } else {
          // Assume 32-bit floats.
          *out << spvtools::utils::FloatProxy<float>(word);
        }
        break;
      default:
        break;
    }
  } else if (operand.num_words == 2) {
    // Multi-word numbers are presented with lower order words first.
    uint64_t bits =
        uint64_t(word) | (uint64_t(inst.words[operand.offset + 1]) << 32);
    switch (operand.number_kind) {
      case SPV_NUMBER_SIGNED_INT:
        *out << int64_t(bits);
        break;
      case SPV_NUMBER_UNSIGNED_INT:
        *out << bits;
        break;
      case SPV_NUMBER_FLOATING:
        // Assume only 64-bit floats.
        *out << spvtools::utils::FloatProxy<double>(bits);
        break;
      default:
        break;
    }
  }
}